

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraohRandomWalk_SRW.h
# Opt level: O2

Estimates * SRW1(Estimates *__return_storage_ptr__,CGraph *cg,Parameters *params)

{
  undefined1 *puVar1;
  bool bVar2;
  size_type __n;
  size_type __n_00;
  Parameters *pPVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  pointer pOVar6;
  result_type rVar7;
  EdgeIdx *pEVar8;
  size_type __n_01;
  difference_type dVar9;
  difference_type dVar10;
  int skip;
  long lVar11;
  Parameters *pPVar12;
  Parameters *pPVar13;
  long lVar14;
  pointer pOVar15;
  long lVar16;
  mt19937 *pmVar17;
  unsigned_long *puVar18;
  Parameters *pPVar19;
  pointer pOVar20;
  pointer __n_02;
  pointer __n_03;
  pointer pOVar21;
  byte bVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  reference rVar26;
  _Bit_iterator __first;
  _Bit_iterator __first_00;
  _Bit_iterator __last;
  _Bit_iterator __last_00;
  Parameters in_stack_ffffffffffffc298;
  double local_29d0;
  pointer local_29b0;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> edge_list;
  vector<bool,_std::allocator<bool>_> visited_edge_set;
  vector<bool,_std::allocator<bool>_> visited_vertex_set;
  uniform_int_distribution<long> dist_parent_nbor;
  OrderedEdgeCollection randomEdgeCollection;
  uniform_int_distribution<long> dist_parent;
  OrderedEdgeCollection local_2860;
  Parameters local_27e8;
  mt19937 mt;
  random_device rd;
  
  bVar22 = 0;
  __n = cg->nVertices;
  __n_00 = cg->nEdges;
  pPVar3 = (Parameters *)params->walk_length;
  pOVar6 = (pointer)*(params->seed_vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl
                     .super__Vector_impl_data._M_start;
  std::random_device::random_device(&rd);
  uVar5 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&mt,(ulong)uVar5);
  edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  randomEdgeCollection.no_of_edges = randomEdgeCollection.no_of_edges & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&visited_vertex_set,__n,(bool *)&randomEdgeCollection,
             (allocator_type *)&visited_edge_set);
  randomEdgeCollection.no_of_edges = randomEdgeCollection.no_of_edges & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&visited_edge_set,__n_00,(bool *)&randomEdgeCollection,
             (allocator_type *)&dist_parent_nbor);
  pEVar8 = cg->offsets;
  lVar11 = pEVar8[(long)pOVar6];
  lVar14 = pEVar8[(long)((long)&pOVar6->u + 1)];
  if (lVar14 == lVar11) {
    pmVar17 = &mt;
    puVar18 = (unsigned_long *)&stack0xffffffffffffc298;
    for (lVar11 = 0x271; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar18 = pmVar17->_M_x[0];
      pmVar17 = (mt19937 *)((long)pmVar17 + (ulong)bVar22 * -0x10 + 8);
      puVar18 = puVar18 + (ulong)bVar22 * -2 + 1;
    }
    pOVar6 = (pointer)AlternateSeed(cg);
    pEVar8 = cg->offsets;
    lVar11 = pEVar8[(long)pOVar6];
    lVar14 = pEVar8[(long)((long)&pOVar6->u + 1)];
  }
  dist_parent._M_param._M_a = 0;
  local_29b0 = (pointer)(lVar14 - lVar11);
  dist_parent._M_param._M_b = (long)&local_29b0[-1].degree + 7;
  lVar11 = pEVar8[(long)pOVar6];
  rVar7 = std::uniform_int_distribution<long>::operator()(&dist_parent,&mt);
  pOVar21 = (pointer)(rVar7 + lVar11);
  __n_02 = (pointer)cg->nbors[(long)pOVar21];
  lVar11 = cg->offsets[(long)((long)&__n_02->u + 1)];
  lVar14 = cg->offsets[(long)__n_02];
  randomEdgeCollection.no_of_edges = (EdgeIdx)pOVar6;
  randomEdgeCollection.edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
  _M_impl.super__Vector_impl_data._M_start = __n_02;
  randomEdgeCollection.edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
  _M_impl.super__Vector_impl_data._M_finish = pOVar21;
  randomEdgeCollection.edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_29b0;
  std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::emplace_back<OrderedEdge>
            (&edge_list,(OrderedEdge *)&randomEdgeCollection);
  rVar26 = std::vector<bool,_std::allocator<bool>_>::operator[]
                     (&visited_vertex_set,(size_type)pOVar6);
  *rVar26._M_p = *rVar26._M_p | rVar26._M_mask;
  rVar26 = std::vector<bool,_std::allocator<bool>_>::operator[]
                     (&visited_vertex_set,(size_type)__n_02);
  *rVar26._M_p = *rVar26._M_p | rVar26._M_mask;
  rVar26 = std::vector<bool,_std::allocator<bool>_>::operator[]
                     (&visited_edge_set,(size_type)pOVar21);
  *rVar26._M_p = *rVar26._M_p | rVar26._M_mask;
  pPVar19 = (Parameters *)0x0;
  pPVar12 = (Parameters *)0x0;
  if (0 < (long)pPVar3) {
    pPVar12 = pPVar3;
  }
  lVar16 = 1;
  local_29d0 = 0.0;
  pPVar13 = pPVar12;
  pOVar21 = (pointer)(lVar11 - lVar14);
  do {
    pOVar15 = pOVar21;
    skip = (int)pPVar13;
    if (pPVar19 == pPVar12) {
      if (params->normalization_count_available == false) {
        randomEdgeCollection.no_of_edges = (EdgeIdx)pPVar3;
        std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
                  (&randomEdgeCollection.edge_list,&edge_list);
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&randomEdgeCollection.visited_edge_set,&visited_edge_set);
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&randomEdgeCollection.visited_vertex_set,&visited_vertex_set);
        randomEdgeCollection.no_of_query = 0;
        OrderedEdgeCollection::OrderedEdgeCollection(&local_2860,&randomEdgeCollection);
        Parameters::Parameters(&local_27e8,params);
        EstimateEdgeCount((Estimates *)&dist_parent_nbor,cg,&local_2860,in_stack_ffffffffffffc298,
                          skip);
        Parameters::~Parameters(&local_27e8);
        OrderedEdgeCollection::~OrderedEdgeCollection(&local_2860);
        dVar23 = (double)dist_parent_nbor._M_param._M_a;
        OrderedEdgeCollection::~OrderedEdgeCollection(&randomEdgeCollection);
      }
      else {
        dVar23 = (double)cg->nEdges;
      }
      dVar23 = dVar23 * 0.5 * (1.0 / (double)(long)pPVar3) * local_29d0;
      if (params->CSS == false) {
        dVar23 = dVar23 * 0.3333333333333333;
      }
      __return_storage_ptr__->fraction_of_vertices_seen = 1.0;
      __return_storage_ptr__->fraction_of_edges_seen = 1.0;
      __return_storage_ptr__->query_complexity = 1.0;
      __return_storage_ptr__->estimate = dVar23;
      randomEdgeCollection.no_of_edges = CONCAT71(randomEdgeCollection.no_of_edges._1_7_,1);
      __first.super__Bit_iterator_base._8_8_ = 0;
      __first.super__Bit_iterator_base._M_p =
           visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      __last.super__Bit_iterator_base._12_4_ = 0;
      __last.super__Bit_iterator_base._M_p =
           visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      __last.super__Bit_iterator_base._M_offset =
           visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      dVar9 = std::__count_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                        (__first,__last,(_Iter_equals_val<const_bool>)&randomEdgeCollection);
      randomEdgeCollection.no_of_edges = CONCAT71(randomEdgeCollection.no_of_edges._1_7_,1);
      __first_00.super__Bit_iterator_base._8_8_ = 0;
      __first_00.super__Bit_iterator_base._M_p =
           visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      __last_00.super__Bit_iterator_base._12_4_ = 0;
      __last_00.super__Bit_iterator_base._M_p =
           visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      __last_00.super__Bit_iterator_base._M_offset =
           visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      dVar10 = std::__count_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                         (__first_00,__last_00,(_Iter_equals_val<const_bool>)&randomEdgeCollection);
      auVar25._0_8_ = (double)(long)__n_00;
      auVar24._0_8_ = (double)dVar9 * 100.0;
      auVar24._8_8_ = (double)lVar16 * 100.0;
      __return_storage_ptr__->fraction_of_vertices_seen =
           ((double)dVar10 * 100.0) / (double)(long)__n;
      auVar25._8_8_ = auVar25._0_8_;
      auVar24 = divpd(auVar24,auVar25);
      __return_storage_ptr__->fraction_of_edges_seen = (double)auVar24._0_8_;
      __return_storage_ptr__->query_complexity = (double)auVar24._8_8_;
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&visited_edge_set.super__Bvector_base<std::allocator<bool>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&visited_vertex_set.super__Bvector_base<std::allocator<bool>_>);
      std::_Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>::~_Vector_base
                (&edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>);
      std::random_device::~random_device(&rd);
      return __return_storage_ptr__;
    }
    dist_parent_nbor._M_param._M_a = 0;
    puVar1 = (undefined1 *)((long)&pOVar15[-1].degree + 7);
    lVar11 = cg->offsets[(long)__n_02];
    dist_parent_nbor._M_param._M_b = (long)puVar1;
    rVar7 = std::uniform_int_distribution<long>::operator()(&dist_parent_nbor,&mt);
    pOVar20 = (pointer)(rVar7 + lVar11);
    lVar16 = lVar16 + 1;
    pEVar8 = cg->offsets;
    __n_03 = (pointer)(&(((Parameters *)cg->nbors)->filename)._M_dataplus)[(long)pOVar20]._M_p;
    pOVar21 = (pointer)(pEVar8[(long)((long)&__n_03->u + 1)] - pEVar8[(long)__n_03]);
    pPVar13 = (Parameters *)cg->nbors;
    if ((pOVar15 != (pointer)0x1) && (pPVar13 = params, params->NB != false)) {
      while (pOVar6 == __n_03) {
        lVar11 = pEVar8[(long)__n_02];
        rVar7 = std::uniform_int_distribution<long>::operator()(&dist_parent_nbor,&mt);
        pOVar20 = (pointer)(rVar7 + lVar11);
        lVar16 = lVar16 + 1;
        pEVar8 = cg->offsets;
        __n_03 = (pointer)(&(((Parameters *)cg->nbors)->filename)._M_dataplus)[(long)pOVar20]._M_p;
        pOVar21 = (pointer)(pEVar8[(long)((long)&__n_03->u + 1)] - pEVar8[(long)__n_03]);
        pPVar13 = (Parameters *)cg->nbors;
      }
    }
    randomEdgeCollection.no_of_edges = (EdgeIdx)__n_02;
    randomEdgeCollection.edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
    _M_impl.super__Vector_impl_data._M_start = __n_03;
    randomEdgeCollection.edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
    _M_impl.super__Vector_impl_data._M_finish = pOVar20;
    randomEdgeCollection.edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar15;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::emplace_back<OrderedEdge>
              (&edge_list,(OrderedEdge *)&randomEdgeCollection);
    rVar26 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&visited_vertex_set,(size_type)__n_03);
    *rVar26._M_p = *rVar26._M_p | rVar26._M_mask;
    rVar26 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&visited_edge_set,(size_type)pOVar20);
    *rVar26._M_p = *rVar26._M_p | rVar26._M_mask;
    __n_01 = Escape::CGraph::getEdgeBinary(cg,(VertexIdx)pOVar6,(VertexIdx)__n_03);
    if ((((pOVar6 == __n_03) || (pOVar6 == __n_02)) || (__n_02 == __n_03)) ||
       (__n_01 == 0xffffffffffffffff)) {
      if (__n_01 != 0xffffffffffffffff) goto LAB_001058fb;
    }
    else {
      bVar2 = params->NB;
      pPVar13 = (Parameters *)CONCAT71((int7)((ulong)pPVar13 >> 8),bVar2);
      if (params->CSS == true) {
        pOVar6 = pOVar15;
        pOVar20 = pOVar21;
        if (bVar2 != false) {
          local_29b0 = (pointer)((long)&local_29b0[-1].degree + 7);
          pPVar13 = (Parameters *)((long)&pOVar21[-1].degree + 7);
          pOVar6 = (pointer)puVar1;
          pOVar20 = (pointer)pPVar13;
        }
        auVar4._8_8_ = (double)(long)pOVar20;
        auVar4._0_8_ = (double)(long)pOVar6;
        auVar24 = divpd(_DAT_00110050,auVar4);
        dVar23 = 1.0 / (auVar24._8_8_ + 1.0 / (double)(long)local_29b0 + auVar24._0_8_);
      }
      else if (bVar2 == false) {
        dVar23 = (double)(long)pOVar15;
      }
      else {
        dVar23 = (double)(long)puVar1;
      }
      local_29d0 = local_29d0 + dVar23;
LAB_001058fb:
      rVar26 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited_edge_set,__n_01);
      *rVar26._M_p = *rVar26._M_p | rVar26._M_mask;
    }
    lVar16 = lVar16 + 1;
    pPVar19 = (Parameters *)((long)&(pPVar19->filename)._M_dataplus._M_p + 1);
    pOVar6 = __n_02;
    __n_02 = __n_03;
    local_29b0 = pOVar15;
  } while( true );
}

Assistant:

Estimates SRW1(CGraph *cg, Parameters params)
{
    /**
     * Setting of various input parameters for executing the algorithm
     */
    VertexIdx n = cg->nVertices;
    EdgeIdx m = cg->nEdges; // Note that m is double of the number of edges in the graph
    // VertexIdx seed_count = params.seed_count;  // Unused for now. Reserved for future use
    EdgeIdx walk_length = params.walk_length;
    VertexIdx seed = params.seed_vertices[0]; // We are working with only one seed vertex for this project

    /**
    * Set up random number generator
    * Using this random number generator initializize a PRNG: this PRNG is passed along to
    * draw an element from various distributions
    */
    std::random_device rd;
    std::mt19937 mt(rd());

    /**
     * Data structures for book-keeping and local variables.
     * We do not really need the OrderedEdge vector for SRW.
     * However, if m is not available, and needs to be estimated based on the random walk,
     * then we need the collection of edges.
     */
    std::vector<OrderedEdge> edge_list;
    std::vector <bool > visited_vertex_set(n,false);
    std::vector <bool > visited_edge_set(m,false);
    VertexIdx no_of_query = 0;  // Counts the number of query made by the algorithm
    double X = 0; // This variable keeps a running count of the estimator
    VertexIdx v1, v2, v3, deg_of_v1, deg_of_v2, deg_of_v3;
    EdgeIdx random_nbor_edge;

    /**
     * Algorithm Initialization: Take two steps of the random walk and collect v1 and v2.
     */

    v1 = seed;
    deg_of_v1 = cg->degree(v1); // degree of parent vertex
    if (deg_of_v1 == 0)  // If we are stuck with an isolate vertex, we change the seed
        v1 = AlternateSeed(cg,mt);
    deg_of_v1 = cg->degree(v1);
    std::uniform_int_distribution<VertexIdx> dist_parent(0, deg_of_v1 - 1);
    no_of_query++; // One query to the uniform random neighbor oracle
    random_nbor_edge = cg->offsets[v1] + dist_parent(mt); // TODO: check randomness. same seeding ok?
    v2 = cg->nbors[random_nbor_edge]; // child is the potential next vertex on the random walk
    deg_of_v2 = cg->degree(v2);// degree of the child vertex

    /**
    * Update data structures
    */
    edge_list.push_back(OrderedEdge{v1, v2, random_nbor_edge, deg_of_v1}); // Note that we do not care of the ordering of the edge.
    visited_vertex_set[v1] = true;
    visited_vertex_set[v2] = true;
    visited_edge_set[random_nbor_edge] = true;


    for (EdgeIdx wL = 0; wL < walk_length; wL++) {  // Perform a random walk of length walk_length from the vertex v2
        std::uniform_int_distribution<VertexIdx> dist_parent_nbor(0, deg_of_v2 - 1); // v2 is the current last visited vertex on the random walk
        random_nbor_edge = cg->offsets[v2] + dist_parent_nbor(mt); // TODO: check randomness. same seeding ok?
        no_of_query++; // One query to the uniform random neighbor oracle
        v3 = cg->nbors[random_nbor_edge]; // v3 is the  new vertex on the random walk
        deg_of_v3 = cg->degree(v3);// degree of the vertex v3

        /**
         * The parameter NB decides if the random walk is non-backtracking.
         * If it is true, then v1-v2-v1 becomes an invalid state.
         * We sample another random neighbor in that case.
         * Also, in final estimation, d'(u)=d(u)-1 is used.
         */
        if (params.NB and deg_of_v2!= 1) { // if v_2 is singleton, then only one option
            while (v1 == v3) { // We reached an invalid state, resample.
                random_nbor_edge = cg->offsets[v2] + dist_parent_nbor(mt); // TODO: check randomness. same seeding ok?
                no_of_query++; // One query to the uniform random neighbor oracle
                v3 = cg->nbors[random_nbor_edge]; // v3 is the  new vertex on the random walk
                deg_of_v3 = cg->degree(v3);// degree of the vertex v3
            }
        }

        /**
         * Update data structures
         */
        edge_list.push_back(OrderedEdge{v2, v3, random_nbor_edge, deg_of_v2}); // Note that we do not care of the ordering of the edge.
        visited_vertex_set[v3] = true;
        visited_edge_set[random_nbor_edge] = true;

        /**
         * Check if v1, v2 and v3 forms a triangle
         * Note that (v1,v2) and (v2,v3) edges are present.
         * So we check if (v1,v3) edge is present and if all v1,v2 and v3 are distinct
         */
        EdgeIdx e = cg->getEdgeBinary(v1,v3);
        no_of_query++; // One query to the edge query oracle
        if (e!= -1 && v1!=v2 && v2!=v3 && v1!=v3) {
            if (params.CSS && params.NB) {  // Both CSS and NB are true
                double denom = (1.0 / (deg_of_v1-1)) +
                                (1.0 /(deg_of_v2-1)) +
                                (1.0 /(deg_of_v3-1));
                X += 1.0 / denom;
            }
            else if (params.CSS){ // Only CSS is true
                double denom = (1.0 / deg_of_v1) + (1.0 /deg_of_v2) + (1.0 /deg_of_v3);
                X += 1.0 / denom;
            }
            else if (params.NB) // Only NB is true
                X+= deg_of_v2 - 1;
            else                // Both CSS and NB are false
                X += deg_of_v2;


        }

        /**
         * Update data structures
         */
        if (e!= -1)
            visited_edge_set[e] =true;
        /**
         * slide the window of history!
         */
        v1 = v2;
        deg_of_v1 = deg_of_v2;
        v2 = v3;
        deg_of_v2 = deg_of_v3;
    }

    double edge_estimate = 0.0;
    /**
     * Depending on whether the total number of edges in the graphs is available or not, compute it.
     */
    if (!params.normalization_count_available) {
        int skip = 25;
        OrderedEdgeCollection randomEdgeCollection = {walk_length, edge_list, visited_edge_set, visited_vertex_set};
        Estimates edge_count_output = EstimateEdgeCount(cg, randomEdgeCollection, params, skip);
        edge_estimate = edge_count_output.estimate;
    }
    else
        edge_estimate = cg->nEdges *1.0;

    /**
     * Estimate the number of triangles.
     */
    double triangleEstimate = 0.0;
    if (params.CSS)
        triangleEstimate = (1.0/walk_length) * X * (edge_estimate / 2.0) ; // Note that m is actually twice the number of edges
    else
        triangleEstimate = (1.0/walk_length) * X * (edge_estimate/2.0) * (1/ 3.0) ; // Note that m is actually twice the number of edges

    /**
     * Populate the return structure
     */
    Estimates return_estimate = {};
    return_estimate.estimate = triangleEstimate;

    VertexIdx edges_seen = std::count(visited_edge_set.begin(),visited_edge_set.end(),true);
    VertexIdx vertices_seen = std::count(visited_vertex_set.begin(),visited_vertex_set.end(), true);

    return_estimate.fraction_of_vertices_seen = vertices_seen * 100.0 / n;
    return_estimate.fraction_of_edges_seen = edges_seen * 100.0 / m;
    return_estimate.query_complexity = no_of_query * 100.0 /m;

    return return_estimate;
}